

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

uint encodeRex(uchar *stream,bool operand64Bit,x86XmmReg dst,x86XmmReg src)

{
  byte bVar1;
  byte bVar2;
  uchar code;
  x86XmmReg src_local;
  x86XmmReg dst_local;
  bool operand64Bit_local;
  uchar *stream_local;
  
  bVar1 = 0;
  if (operand64Bit) {
    bVar1 = 8;
  }
  bVar2 = 0;
  if (7 < (int)dst) {
    bVar2 = 4;
  }
  bVar1 = bVar1 | bVar2 | 7 < (int)src;
  if (bVar1 != 0) {
    *stream = bVar1 | 0x40;
  }
  stream_local._4_4_ = (uint)(bVar1 != 0);
  return stream_local._4_4_;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86XmmReg dst, x86XmmReg src)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (dst >= rXMM8 ? 0x04 : 0x00) | (src >= rXMM8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}